

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::set_last_prop(CVmImageLoader *this,vm_prop_id_t last_prop)

{
  vm_val_t new_cont;
  vm_val_t new_val;
  vm_val_t idx_val;
  CVmObjVector *vec;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  vm_val_t local_28;
  CVmObject *local_18;
  
  local_18 = vm_objp(0);
  vm_val_t::set_int(&local_28,1);
  vm_val_t::set_propid((vm_val_t *)&stack0xffffffffffffffc8,G_predef_X.last_prop);
  CVmObject::set_index_val
            ((CVmObject *)in_stack_ffffffffffffffd0.native_desc,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,(vm_val_t *)0x30d76a);
  return;
}

Assistant:

void CVmImageLoader::set_last_prop(VMG_ vm_prop_id_t last_prop)
{
    /* get the LastPropObj vector */
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   set up the values - the index is always 1, since the vector
     *   contains only one element; and the value contains the new last
     *   property ID 
     */
    vm_val_t idx_val, new_val;
    idx_val.set_int(1);
    new_val.set_propid(G_predef->last_prop);

    /* update the vector */
    vm_val_t new_cont;
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &new_val);
}